

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Parser::parseJson(Parser *this)

{
  int iVar1;
  Parser *in_RDI;
  char *in_stack_00000010;
  Parser *in_stack_00000018;
  int i;
  Parser *in_stack_00000040;
  Parser *in_stack_00000060;
  Parser *in_stack_000000a8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  skipWhiteSpace(in_stack_00000018,in_stack_00000010);
  iVar1 = consume(in_RDI);
  if (-1 < iVar1) {
    if (iVar1 == 0x22) {
      parseString(in_stack_000000a8);
    }
    else if (iVar1 == 0x5b) {
      parseArray((Parser *)CONCAT44(0x5b,in_stack_fffffffffffffff0));
    }
    else if (iVar1 == 0x66) {
      parseFalse((Parser *)CONCAT44(0x66,in_stack_ffffffffffffffe0));
    }
    else if (iVar1 == 0x6e) {
      parseNull((Parser *)CONCAT44(0x6e,in_stack_ffffffffffffffe0));
    }
    else if (iVar1 == 0x74) {
      parseTrue((Parser *)CONCAT44(0x74,in_stack_ffffffffffffffe0));
    }
    else if (iVar1 == 0x7b) {
      parseObject(in_stack_00000040);
    }
    else {
      unconsume(in_RDI);
      parseNumber(in_stack_00000060);
    }
  }
  return;
}

Assistant:

void Parser::parseJson() {
  skipWhiteSpace("Expecting item");  // return value intentionally not checked

  int i = consume();
  if (i < 0) {
    return;
  }
  switch (i) {
    case '{':
      parseObject();  // this consumes the closing '}' or throws
      break;
    case '[':
      parseArray();  // this consumes the closing ']' or throws
      break;
    case 't':
      parseTrue();  // this consumes "rue" or throws
      break;
    case 'f':
      parseFalse();  // this consumes "alse" or throws
      break;
    case 'n':
      parseNull();  // this consumes "ull" or throws
      break;
    case '"':
      parseString();
      break;
    default: {
      // everything else must be a number or is invalid...
      // this includes '-' and '0' to '9'. scanNumber() will
      // throw if the input is non-numeric
      unconsume();
      parseNumber();  // this consumes the number or throws
      break;
    }
  }
}